

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O2

bool __thiscall ProStringList::contains(ProStringList *this,QString *str,CaseSensitivity cs)

{
  bool bVar1;
  long in_FS_OFFSET;
  ProString local_50;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  ProString::ProString(&local_50,str);
  bVar1 = contains(this,&local_50,cs);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool contains(const QString &str, Qt::CaseSensitivity cs = Qt::CaseSensitive) const
        { return contains(ProString(str), cs); }